

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult
testing::internal::
CmpHelperEQ<mp::BasicProblem<mp::BasicProblemParams<int>>::MutAlgebraicCon,mp::BasicProblem<mp::BasicProblemParams<int>>::BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>
          (char *expected_expression,char *actual_expression,MutAlgebraicCon *expected,
          BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          *actual)

{
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  char *in_RCX;
  MutAlgebraicCon *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  MutAlgebraicCon *in_RDI;
  string *in_R8;
  AssertionResult AVar5;
  MutAlgebraicCon *pMVar6;
  BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  in_stack_ffffffffffffff78;
  string local_78 [32];
  string local_58 [39];
  string *actual_value;
  MutAlgebraicCon *expected_expression_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar4
  ;
  
  unique0x00012000 = *(undefined8 *)in_R8;
  actual_value = (string *)in_R8->_M_string_length;
  pMVar6 = in_RDI;
  bVar3 = mp::BasicProblem<mp::BasicProblemParams<int>>::
          BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>>>
          ::operator==(&in_RDI->
                        super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                       ,in_stack_ffffffffffffff78);
  if (bVar3) {
    AVar5 = AssertionSuccess();
    sVar4 = AVar5.message_.ptr_;
  }
  else {
    expected_expression_00 = in_RDX;
    FormatForComparisonFailureMessage<mp::BasicProblem<mp::BasicProblemParams<int>>::MutAlgebraicCon,mp::BasicProblem<mp::BasicProblemParams<int>>::BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>
              (in_RDI,(BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                       *)in_RDX);
    FormatForComparisonFailureMessage<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>,mp::BasicProblem<mp::BasicProblemParams<int>>::MutAlgebraicCon>
              ((BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                *)in_RDI,in_RDX);
    uVar2 = stack0xffffffffffffffc8;
    uVar1 = (ulong)stack0xffffffffffffffc8 >> 0x38;
    bVar3 = SUB81(uVar1,0);
    unique0x10000145 = uVar2;
    EqFailure((char *)expected_expression_00,in_RCX,in_R8,actual_value,bVar3);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_58);
    sVar4.ptr_ = extraout_RDX;
  }
  AVar5.message_.ptr_ = sVar4.ptr_;
  AVar5._0_8_ = pMVar6;
  return AVar5;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}